

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8>::forward_mul_mat
          (tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int64_t iVar4;
  float *bs;
  long lVar5;
  long lVar6;
  ggml_from_float_t p_Var7;
  int iVar8;
  long lVar9;
  ggml_type_traits_cpu *pgVar10;
  long in_RDX;
  int *in_RSI;
  int iter;
  int64_t src0_end;
  int64_t src0_start;
  size_t src1_col_stride;
  void *src1_wdata;
  int64_t i11_1;
  int64_t i11;
  int64_t i11_processed;
  ggml_from_float_t from_float;
  size_t nbw1;
  char *wdata;
  int nth;
  int ith;
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb0;
  int64_t ne3;
  int64_t ne2;
  int64_t ne1;
  int64_t ne0;
  size_t nb13;
  size_t nb12;
  size_t nb11;
  size_t nb10;
  int64_t ne13;
  int64_t ne12;
  int64_t ne11;
  int64_t ne10;
  size_t nb03;
  size_t nb02;
  size_t nb01;
  size_t nb00;
  int64_t ne03;
  int64_t ne02;
  int64_t ne01;
  int64_t ne00;
  ggml_tensor *dst;
  ggml_tensor *src1;
  ggml_tensor *src0;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  void *in_stack_fffffffffffffe60;
  void *in_stack_fffffffffffffe68;
  float *pfVar11;
  float *in_stack_fffffffffffffe70;
  float *in_stack_fffffffffffffe78;
  ggml_threadpool *in_stack_fffffffffffffe80;
  long local_178;
  long in_stack_fffffffffffffe90;
  long local_168;
  int local_14c;
  long local_128;
  long local_120;
  
  piVar3 = *(int **)(in_RDX + 0xa0);
  pfVar11 = *(float **)(*(long *)(in_RDX + 0x98) + 0x18);
  iVar4 = *(int64_t *)(piVar3 + 4);
  bs = *(float **)(piVar3 + 6);
  lVar5 = *(long *)(piVar3 + 0xe);
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  if (*(float **)(in_RDX + 0x10) != pfVar11) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x17c3,"GGML_ASSERT(%s) failed","ne0 == ne01");
  }
  if (*(float **)(in_RDX + 0x18) != bs) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x17c4,"GGML_ASSERT(%s) failed","ne1 == ne11");
  }
  if (*(long *)(in_RDX + 0x20) != *(long *)(piVar3 + 8)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x17c5,"GGML_ASSERT(%s) failed","ne2 == ne12");
  }
  if (*(long *)(in_RDX + 0x28) != *(long *)(piVar3 + 10)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x17c6,"GGML_ASSERT(%s) failed","ne3 == ne13");
  }
  if (*(long *)(in_RDX + 0x30) != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x17c9,"GGML_ASSERT(%s) failed","nb0 == sizeof(float)");
  }
  if (*(ulong *)(in_RDX + 0x38) < 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x17ca,"GGML_ASSERT(%s) failed","nb0 <= nb1");
  }
  if (*(ulong *)(in_RDX + 0x40) < *(ulong *)(in_RDX + 0x38)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x17cb,"GGML_ASSERT(%s) failed","nb1 <= nb2");
  }
  if (*(ulong *)(in_RDX + 0x40) <= *(ulong *)(in_RDX + 0x48)) {
    if (*piVar3 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
                 ,0x17ce,"GGML_ASSERT(%s) failed","src1->type == GGML_TYPE_F32");
    }
    iVar8 = ggml_n_dims(*(undefined8 *)(in_RDX + 0x98));
    if (iVar8 == 2) {
      lVar6 = *(long *)(in_RSI + 4);
      lVar9 = ggml_row_size(8,iVar4);
      pgVar10 = ggml_get_type_traits_cpu(GGML_TYPE_Q8_0);
      p_Var7 = pgVar10->from_float;
      for (local_120 = (long)(iVar1 << 2); local_120 < (long)bs - (long)bs % 4;
          local_120 = (iVar2 << 2) + local_120) {
        ggml_quantize_mat_t<4l,(ggml_type)8>
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                   (int64_t)in_stack_fffffffffffffe60,
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      for (local_128 = (long)bs + ((long)iVar1 - (long)bs % 4); local_128 < (long)bs;
          local_128 = iVar2 + local_128) {
        (*p_Var7)((float *)(*(long *)(piVar3 + 0x3e) + local_128 * lVar5),
                  (void *)(lVar6 + local_128 * lVar9),iVar4);
      }
      ggml_barrier(in_stack_fffffffffffffe80);
      ggml_row_size(8,iVar4);
      local_168 = ((long)iVar1 * (long)pfVar11) / (long)iVar2;
      local_178 = ((long)(iVar1 + 1) * (long)pfVar11) / (long)iVar2;
      if (local_168 % 4 != 0) {
        in_stack_fffffffffffffe90 = local_168 + 4;
        local_168 = in_stack_fffffffffffffe90 - local_168 % 4;
      }
      if (local_178 % 4 != 0) {
        in_stack_fffffffffffffe80 = (ggml_threadpool *)(local_178 + 4);
        local_178 = (long)in_stack_fffffffffffffe80 - local_178 % 4;
      }
      if (local_168 < local_178) {
        if (3 < (long)bs) {
          in_stack_fffffffffffffe70 = bs;
          gemm<block_q4_0,4l,4l,(ggml_type)8>
                    ((int)((ulong)in_stack_fffffffffffffe80 >> 0x20),pfVar11,(size_t)bs,
                     in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                     (int)in_stack_fffffffffffffe90);
          in_stack_fffffffffffffe78 = pfVar11;
        }
        pfVar11 = bs;
        for (local_14c = (int)bs - (int)((long)bs % 4); (long)local_14c < (long)bs;
            local_14c = local_14c + 1) {
          gemv<block_q4_0,4l,4l,(ggml_type)8>
                    ((int)((ulong)in_stack_fffffffffffffe80 >> 0x20),in_stack_fffffffffffffe78,
                     (size_t)in_stack_fffffffffffffe70,pfVar11,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe5c,(int)in_stack_fffffffffffffe90);
        }
      }
      return;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x17d0,"GGML_ASSERT(%s) failed","ggml_n_dims(op->src[0]) == 2");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,0x17cc,"GGML_ASSERT(%s) failed","nb2 <= nb3");
}

Assistant:

void forward_mul_mat(ggml_compute_params * params, ggml_tensor * op) {
        const ggml_tensor * src0 = op->src[0];
        const ggml_tensor * src1 = op->src[1];
        ggml_tensor *       dst  = op;

        GGML_TENSOR_BINARY_OP_LOCALS

        const int ith = params->ith;
        const int nth = params->nth;

        GGML_ASSERT(ne0 == ne01);
        GGML_ASSERT(ne1 == ne11);
        GGML_ASSERT(ne2 == ne12);
        GGML_ASSERT(ne3 == ne13);

        // dst cannot be transposed or permuted
        GGML_ASSERT(nb0 == sizeof(float));
        GGML_ASSERT(nb0 <= nb1);
        GGML_ASSERT(nb1 <= nb2);
        GGML_ASSERT(nb2 <= nb3);

        GGML_ASSERT(src1->type == GGML_TYPE_F32);

        GGML_ASSERT(ggml_n_dims(op->src[0]) == 2);
        // GGML_ASSERT(ggml_n_dims(op->src[1]) == 2);

        char *       wdata = static_cast<char *>(params->wdata);
        const size_t nbw1  = ggml_row_size(PARAM_TYPE, ne10);

        assert(params->wsize >= nbw1 * ne11);

        const ggml_from_float_t from_float = ggml_get_type_traits_cpu(PARAM_TYPE)->from_float;

        int64_t i11_processed = 0;
        for (int64_t i11 = ith * 4; i11 < ne11 - ne11 % 4; i11 += nth * 4) {
            ggml_quantize_mat_t<INTER_SIZE, PARAM_TYPE>((float *) ((char *) src1->data + i11 * nb11), (void *) (wdata + i11 * nbw1), 4, ne10);
        }

        i11_processed = ne11 - ne11 % 4;
        for (int64_t i11 = i11_processed + ith; i11 < ne11; i11 += nth) {
            from_float((float *) ((char *) src1->data + i11 * nb11), (void *) (wdata + i11 * nbw1), ne10);
        }

        ggml_barrier(params->threadpool);

        const void * src1_wdata      = params->wdata;
        const size_t src1_col_stride = ggml_row_size(PARAM_TYPE, ne10);
        int64_t      src0_start      = (ith * ne01) / nth;
        int64_t      src0_end        = ((ith + 1) * ne01) / nth;
        src0_start = (src0_start % NB_COLS) ? src0_start + NB_COLS - (src0_start % NB_COLS) : src0_start;
        src0_end   = (src0_end   % NB_COLS) ? src0_end   + NB_COLS - (src0_end   % NB_COLS) : src0_end;
        if (src0_start >= src0_end) {
            return;
        }

        // If there are more than three rows in src1, use gemm; otherwise, use gemv.
        if (ne11 > 3) {
            gemm<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                    (float *) ((char *) dst->data) + src0_start, ne01,
                    (const char *) src0->data + src0_start * nb01,
                    (const char *) src1_wdata, ne11 - ne11 % 4, src0_end - src0_start);
        }
        for (int iter = ne11 - ne11 % 4; iter < ne11; iter++) {
            gemv<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                    (float *) ((char *) dst->data + (iter * nb1)) + src0_start, ne01,
                    (const char *) src0->data + src0_start * nb01,
                    (const char *) src1_wdata + (src1_col_stride * iter), 1,
                    src0_end - src0_start);
        }
    }